

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreDisassembler.c
# Opt level: O1

DecodeStatus DecodeL2OpInstructionFail(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  DecodeStatus DVar1;
  uint uVar2;
  void *Decoder_00;
  
  uVar2 = Insn >> 0x10 & 0xf;
  Decoder_00 = (void *)(ulong)uVar2;
  uVar2 = Insn >> 0x17 & 0x1f0 | uVar2;
  if (uVar2 < 0x10c) {
    if (uVar2 < 0x5c) {
      if (uVar2 < 0x2c) {
        if (uVar2 == 0xc) {
          uVar2 = 0xe5;
        }
        else {
          if (uVar2 != 0x1c) {
            return MCDisassembler_Fail;
          }
          uVar2 = 0xf2;
        }
      }
      else if (uVar2 == 0x2c) {
        uVar2 = 0x1b;
      }
      else if (uVar2 == 0x3c) {
        uVar2 = 0x8e;
      }
      else {
        if (uVar2 != 0x4c) {
          return MCDisassembler_Fail;
        }
        uVar2 = 0x87;
      }
    }
    else if (uVar2 < 0x7c) {
      if (uVar2 == 0x5c) {
        uVar2 = 0x80;
      }
      else {
        if (uVar2 != 0x6c) {
          return MCDisassembler_Fail;
        }
        uVar2 = 0x7f;
      }
    }
    else if (uVar2 == 0x7c) {
      uVar2 = 0xad;
    }
    else if (uVar2 == 0x8c) {
      uVar2 = 0x45;
    }
    else {
      if (uVar2 != 0x9c) {
        return MCDisassembler_Fail;
      }
      uVar2 = 0x46;
    }
  }
  else if (uVar2 < 0x13c) {
    if (299 < uVar2) {
      if (uVar2 == 300) {
        uVar2 = 0x1a;
      }
      else if (uVar2 == 0x12d) {
        uVar2 = 0xb3;
      }
      else {
        if (uVar2 != 0x12e) {
          return MCDisassembler_Fail;
        }
        uVar2 = 0x6f;
      }
      MCInst_setOpcode(Inst,uVar2);
      DVar1 = DecodeL2RUSBitpInstruction(Inst,Insn,Address,Decoder_00);
      return DVar1;
    }
    if (uVar2 == 0x10c) {
      uVar2 = 0xd9;
    }
    else {
      if (uVar2 != 0x11c) {
        return MCDisassembler_Fail;
      }
      uVar2 = 0xda;
    }
  }
  else {
    if (uVar2 < 0x15c) {
      if (uVar2 == 0x13c) {
        uVar2 = 0x8d;
      }
      else {
        if (uVar2 != 0x14c) {
          return MCDisassembler_Fail;
        }
        uVar2 = 0x86;
      }
      MCInst_setOpcode(Inst,uVar2);
      DVar1 = DecodeL2RUSInstruction(Inst,Insn,Address,Decoder_00);
      return DVar1;
    }
    if (uVar2 == 0x15c) {
      MCInst_setOpcode(Inst,0x41);
      DVar1 = DecodeL3RSrcDstInstruction(Inst,Insn,Address,Decoder_00);
      return DVar1;
    }
    if (uVar2 == 0x18c) {
      uVar2 = 0xb8;
    }
    else {
      if (uVar2 != 0x19c) {
        return MCDisassembler_Fail;
      }
      uVar2 = 0xb9;
    }
  }
  MCInst_setOpcode(Inst,uVar2);
  DVar1 = DecodeL3RInstruction(Inst,Insn,Address,Decoder_00);
  return DVar1;
}

Assistant:

static DecodeStatus DecodeL2OpInstructionFail(MCInst *Inst, unsigned Insn, uint64_t Address,
		void *Decoder)
{
	// Try and decode as a L3R / L2RUS instruction.
	unsigned Opcode = fieldFromInstruction_4(Insn, 16, 4) |
		fieldFromInstruction_4(Insn, 27, 5) << 4;
	switch (Opcode) {
		case 0x0c:
			MCInst_setOpcode(Inst, XCore_STW_l3r);
			return DecodeL3RInstruction(Inst, Insn, Address, Decoder);
		case 0x1c:
			MCInst_setOpcode(Inst, XCore_XOR_l3r);
			return DecodeL3RInstruction(Inst, Insn, Address, Decoder);
		case 0x2c:
			MCInst_setOpcode(Inst, XCore_ASHR_l3r);
			return DecodeL3RInstruction(Inst, Insn, Address, Decoder);
		case 0x3c:
			MCInst_setOpcode(Inst, XCore_LDAWF_l3r);
			return DecodeL3RInstruction(Inst, Insn, Address, Decoder);
		case 0x4c:
			MCInst_setOpcode(Inst, XCore_LDAWB_l3r);
			return DecodeL3RInstruction(Inst, Insn, Address, Decoder);
		case 0x5c:
			MCInst_setOpcode(Inst, XCore_LDA16F_l3r);
			return DecodeL3RInstruction(Inst, Insn, Address, Decoder);
		case 0x6c:
			MCInst_setOpcode(Inst, XCore_LDA16B_l3r);
			return DecodeL3RInstruction(Inst, Insn, Address, Decoder);
		case 0x7c:
			MCInst_setOpcode(Inst, XCore_MUL_l3r);
			return DecodeL3RInstruction(Inst, Insn, Address, Decoder);
		case 0x8c:
			MCInst_setOpcode(Inst, XCore_DIVS_l3r);
			return DecodeL3RInstruction(Inst, Insn, Address, Decoder);
		case 0x9c:
			MCInst_setOpcode(Inst, XCore_DIVU_l3r);
			return DecodeL3RInstruction(Inst, Insn, Address, Decoder);
		case 0x10c:
			MCInst_setOpcode(Inst, XCore_ST16_l3r);
			return DecodeL3RInstruction(Inst, Insn, Address, Decoder);
		case 0x11c:
			MCInst_setOpcode(Inst, XCore_ST8_l3r);
			return DecodeL3RInstruction(Inst, Insn, Address, Decoder);
		case 0x12c:
			MCInst_setOpcode(Inst, XCore_ASHR_l2rus);
			return DecodeL2RUSBitpInstruction(Inst, Insn, Address, Decoder);
		case 0x12d:
			MCInst_setOpcode(Inst, XCore_OUTPW_l2rus);
			return DecodeL2RUSBitpInstruction(Inst, Insn, Address, Decoder);
		case 0x12e:
			MCInst_setOpcode(Inst, XCore_INPW_l2rus);
			return DecodeL2RUSBitpInstruction(Inst, Insn, Address, Decoder);
		case 0x13c:
			MCInst_setOpcode(Inst, XCore_LDAWF_l2rus);
			return DecodeL2RUSInstruction(Inst, Insn, Address, Decoder);
		case 0x14c:
			MCInst_setOpcode(Inst, XCore_LDAWB_l2rus);
			return DecodeL2RUSInstruction(Inst, Insn, Address, Decoder);
		case 0x15c:
			MCInst_setOpcode(Inst, XCore_CRC_l3r);
			return DecodeL3RSrcDstInstruction(Inst, Insn, Address, Decoder);
		case 0x18c:
			MCInst_setOpcode(Inst, XCore_REMS_l3r);
			return DecodeL3RInstruction(Inst, Insn, Address, Decoder);
		case 0x19c:
			MCInst_setOpcode(Inst, XCore_REMU_l3r);
			return DecodeL3RInstruction(Inst, Insn, Address, Decoder);
	}

	return MCDisassembler_Fail;
}